

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

uint32_t leb_EncodeNode(leb_Heap *leb,leb_Node node)

{
  uint32_t uVar1;
  leb_Node node_00;
  uint32_t nodeCount;
  leb_Node sibling;
  leb_Node nodeIterator;
  uint32_t nodeID;
  leb_Heap *leb_local;
  leb_Node node_local;
  
  nodeIterator.id = 0;
  for (sibling = node; 1 < sibling.id; sibling = leb__ParentNode_Fast(sibling)) {
    node_00 = leb__LeftSiblingNode(sibling);
    uVar1 = leb__HeapRead(leb,node_00);
    nodeIterator.id = (sibling.id & 1) * uVar1 + nodeIterator.id;
  }
  return nodeIterator.id;
}

Assistant:

LEBDEF uint32_t leb_EncodeNode(const leb_Heap *leb, const leb_Node node)
{
    uint32_t nodeID = 0u;
    leb_Node nodeIterator = node;

    while (nodeIterator.id > 1u) {
        leb_Node sibling = leb__LeftSiblingNode(nodeIterator);
        uint32_t nodeCount = leb__HeapRead(leb, {sibling.id, sibling.depth});

        nodeID+= (nodeIterator.id & 1u) * nodeCount;
        nodeIterator = leb__ParentNode_Fast(nodeIterator);
    }

    return nodeID;
}